

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(TPZDohrSubstructCondense<double> *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZDohrSubstructCondense_0181b188;
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::TPZAutoPointer(&this->fMatRedComplete);
  this->fNEquations = -1;
  this->fNumInternalEquations = -1;
  this->fNumExternalEquations = -1;
  (this->fCoarseNodes)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fCoarseNodes).fStore = (int *)0x0;
  (this->fCoarseNodes).fNElements = 0;
  (this->fCoarseNodes).fNAlloc = 0;
  TPZFMatrix<double>::TPZFMatrix(&this->fPhiC);
  TPZFMatrix<double>::TPZFMatrix(&this->fPhiC_Weighted_Condensed);
  TPZManVector<double,_10>::TPZManVector(&this->fWeights,0);
  TPZFMatrix<double>::TPZFMatrix(&this->fKCi);
  p_Var1 = &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->wasRealloc = false;
  TPZAutoPointer<TPZMatRed<double,_TPZFMatrix<double>_>_>::TPZAutoPointer(&this->fMatRed);
  TPZFMatrix<double>::TPZFMatrix(&this->fLocalLoad);
  TPZFMatrix<double>::TPZFMatrix(&this->fLocalWeightedResidual);
  TPZFMatrix<double>::TPZFMatrix(&this->fAdjustSolution);
  return;
}

Assistant:

TPZDohrSubstructCondense<TVar>::TPZDohrSubstructCondense() : fNEquations(-1), fNumInternalEquations(-1), fNumExternalEquations(-1), wasRealloc(false)
{
	//Inicializacao
}